

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStore(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  reference this_00;
  pointer pMVar2;
  bool local_51;
  BasicType local_48 [2];
  Store *local_40;
  Store *store;
  Expression *local_30;
  Expression *ret;
  TranslateToFuzzReader *local_20;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (TranslateToFuzzReader *)type.id;
  if (((this->allowMemory & 1U) == 0) || (bVar1 = Type::isRef((Type *)&this_local), bVar1)) {
    ret = (Expression *)this_local;
    type_local.id = (uintptr_t)makeTrivial(this,(Type)this_local);
  }
  else {
    store = (Store *)this_local;
    local_30 = makeNonAtomicStore(this,(Type)this_local);
    local_40 = Expression::dynCast<wasm::Store>(local_30);
    if (local_40 == (Store *)0x0) {
      type_local.id = (uintptr_t)local_30;
    }
    else {
      local_48[1] = 2;
      bVar1 = Type::operator!=(&local_40->value->type,local_48 + 1);
      local_51 = false;
      if (bVar1) {
        local_48[0] = i64;
        local_51 = Type::operator!=(&local_40->value->type,local_48);
      }
      if (local_51 == false) {
        bVar1 = FeatureSet::hasAtomics((FeatureSet *)(this->wasm + 0x178));
        if ((!bVar1) || (bVar1 = oneIn(this,2), bVar1)) {
          type_local.id = (uintptr_t)local_40;
        }
        else {
          this_00 = std::
                    vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                    ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                  *)(this->wasm + 0x78),0);
          pMVar2 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                             (this_00);
          pMVar2->shared = true;
          local_40->isAtomic = true;
          Address::operator=(&local_40->align,(ulong)local_40->bytes);
          type_local.id = (uintptr_t)local_40;
        }
      }
      else {
        type_local.id = (uintptr_t)local_40;
      }
    }
  }
  return (Expression *)type_local.id;
}

Assistant:

Expression* TranslateToFuzzReader::makeStore(Type type) {
  if (!allowMemory || type.isRef()) {
    return makeTrivial(type);
  }
  auto* ret = makeNonAtomicStore(type);
  auto* store = ret->dynCast<Store>();
  if (!store) {
    return ret;
  }
  if (store->value->type != Type::i32 && store->value->type != Type::i64) {
    return store;
  }
  if (!wasm.features.hasAtomics() || oneIn(2)) {
    return store;
  }
  // make it atomic
  wasm.memories[0]->shared = true;
  store->isAtomic = true;
  store->align = store->bytes;
  return store;
}